

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 1806.cpp
# Opt level: O0

void dcstr(int x)

{
  bool bVar1;
  const_reference pvVar2;
  value_type local_58;
  int local_50;
  int local_4c;
  int v;
  int i;
  int u;
  value_type local_38;
  undefined1 local_30 [8];
  priority_queue<pp,_std::vector<pp,_std::allocator<pp>_>,_std::less<pp>_> pq;
  int x_local;
  
  pq._28_4_ = x;
  std::priority_queue<pp,std::vector<pp,std::allocator<pp>>,std::less<pp>>::
  priority_queue<std::vector<pp,std::allocator<pp>>,void>
            ((priority_queue<pp,std::vector<pp,std::allocator<pp>>,std::less<pp>> *)local_30);
  dis[(int)pq._28_4_] = 0;
  local_38.d = dis[(int)pq._28_4_];
  local_38.u = pq._28_4_;
  std::priority_queue<pp,_std::vector<pp,_std::allocator<pp>_>,_std::less<pp>_>::push
            ((priority_queue<pp,_std::vector<pp,_std::allocator<pp>_>,_std::less<pp>_> *)local_30,
             &local_38);
  while (bVar1 = std::priority_queue<pp,_std::vector<pp,_std::allocator<pp>_>,_std::less<pp>_>::
                 empty((priority_queue<pp,_std::vector<pp,_std::allocator<pp>_>,_std::less<pp>_> *)
                       local_30), ((bVar1 ^ 0xffU) & 1) != 0) {
    pvVar2 = std::priority_queue<pp,_std::vector<pp,_std::allocator<pp>_>,_std::less<pp>_>::top
                       ((priority_queue<pp,_std::vector<pp,_std::allocator<pp>_>,_std::less<pp>_> *)
                        local_30);
    v = pvVar2->u;
    std::priority_queue<pp,_std::vector<pp,_std::allocator<pp>_>,_std::less<pp>_>::pop
              ((priority_queue<pp,_std::vector<pp,_std::allocator<pp>_>,_std::less<pp>_> *)local_30)
    ;
    if ((vis[v] & 1U) == 0) {
      vis[v] = true;
      for (local_4c = head[v]; local_4c != -1; local_4c = edge[local_4c].next) {
        local_50 = edge[local_4c].v;
        if (dis[v] + edge[local_4c].w < dis[local_50]) {
          par[local_50] = v;
          dis[local_50] = dis[v] + edge[local_4c].w;
          local_58.d = dis[local_50];
          local_58.u = local_50;
          std::priority_queue<pp,_std::vector<pp,_std::allocator<pp>_>,_std::less<pp>_>::push
                    ((priority_queue<pp,_std::vector<pp,_std::allocator<pp>_>,_std::less<pp>_> *)
                     local_30,&local_58);
        }
      }
    }
  }
  std::priority_queue<pp,_std::vector<pp,_std::allocator<pp>_>,_std::less<pp>_>::~priority_queue
            ((priority_queue<pp,_std::vector<pp,_std::allocator<pp>_>,_std::less<pp>_> *)local_30);
  return;
}

Assistant:

void dcstr(int x){
    std::priority_queue<pp> pq;
    dis[x] = 0;
    pq.push({dis[x], x});
    while (!pq.empty()){
        int u = pq.top().u;
        pq.pop();
        if (vis[u]) {
            continue;
        }
        vis[u] = true;
        for (int i = head[u]; i != -1 ; i = edge[i].next) {
            int v = edge[i].v;
            if (dis[v] > dis[u] + edge[i].w){
                par[v] = u;
                dis[v] = dis[u] + edge[i].w;
                pq.push({dis[v], v});
            }
        }
    }
}